

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  int iVar12;
  int iVar13;
  IdxElement *pIVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  fpclass_type *pfVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  uint *puVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  int start_00;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  byte bVar35;
  type t;
  cpp_dec_float<200U,_int,_void> local_848;
  uint local_7c8 [30];
  uint local_750 [28];
  IdxElement local_6e0;
  IdxElement local_65c;
  IdxElement local_5d8;
  IdxElement local_554;
  IdxElement local_4d0;
  IdxElement local_44c;
  cpp_dec_float<200U,_int,_void> local_3c8;
  IdxElement local_348;
  IdxElement local_2c4;
  IdxElement local_240;
  IdxElement local_1bc;
  IdxElement local_138;
  IdxElement local_b4;
  ulong uVar31;
  
  bVar35 = 0;
  uVar28 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar30 = end - 1;
    uVar31 = (ulong)uVar30;
    uVar17 = uVar30 - start;
    if (0x18 < (int)uVar17) {
LAB_0059f62f:
      local_7c8[0x18] = 0;
      local_7c8[0x19] = 0;
      local_7c8[0x1a] = 0;
      local_7c8[0x1b] = 0;
      local_7c8[0x14] = 0;
      local_7c8[0x15] = 0;
      local_7c8[0x16] = 0;
      local_7c8[0x17] = 0;
      local_7c8[0x10] = 0;
      local_7c8[0x11] = 0;
      local_7c8[0x12] = 0;
      local_7c8[0x13] = 0;
      local_7c8[0xc] = 0;
      local_7c8[0xd] = 0;
      local_7c8[0xe] = 0;
      local_7c8[0xf] = 0;
      local_7c8[8] = 0;
      local_7c8[9] = 0;
      local_7c8[10] = 0;
      local_7c8[0xb] = 0;
      local_7c8[4] = 0;
      local_7c8[5] = 0;
      local_7c8[6] = 0;
      local_7c8[7] = 0;
      local_7c8[0] = 0;
      local_7c8[1] = 0;
      local_7c8[2] = 0;
      local_7c8[3] = 0;
      start_00 = (int)uVar28;
      iVar18 = (uVar17 >> 1) + start_00;
      pIVar1 = keys + iVar18;
      pnVar25 = &keys[iVar18].val;
      iVar18 = *(int *)((long)(pnVar25 + -1) + 0x7c);
      pnVar22 = pnVar25;
      puVar23 = local_750;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
      }
      iVar5 = (pnVar25->m_backend).exp;
      bVar3 = (pnVar25->m_backend).neg;
      fVar6 = (pnVar25->m_backend).fpclass;
      iVar7 = (pnVar25->m_backend).prec_elem;
      lVar15 = (long)start_00;
      uVar30 = (uint)uVar31;
      uVar26 = uVar28;
      uVar34 = uVar31;
      do {
        iVar13 = (int)uVar26;
        iVar32 = (int)uVar34;
        uVar27 = uVar26;
        if ((type & 1U) == 0) {
          if (iVar13 < (int)uVar30) {
            pfVar20 = &keys[iVar13].val.m_backend.fpclass;
            do {
              local_1bc.idx = pfVar20[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
              pnVar22 = &local_1bc.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_1bc.val.m_backend.exp = pfVar20[-2];
              local_1bc.val.m_backend.neg = *(bool *)(pfVar20 + -1);
              local_1bc.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
              local_554.idx = iVar18;
              puVar23 = local_750;
              pnVar22 = &local_554.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_554.val.m_backend.exp = iVar5;
              local_554.val.m_backend.neg = bVar3;
              local_554.val.m_backend.fpclass = fVar6;
              local_554.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_1bc,&local_554);
              uVar27 = uVar26;
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (0 < iVar13) break;
              uVar17 = (int)uVar26 + 1;
              uVar26 = (ulong)uVar17;
              pfVar20 = pfVar20 + 0x21;
              uVar27 = uVar31;
            } while (uVar30 != uVar17);
          }
          if (start_00 < iVar32) {
            uVar34 = (ulong)iVar32;
            pfVar20 = &keys[uVar34].val.m_backend.fpclass;
            do {
              local_240.idx = pfVar20[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
              pnVar22 = &local_240.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_240.val.m_backend.exp = pfVar20[-2];
              local_240.val.m_backend.neg = *(bool *)(pfVar20 + -1);
              local_240.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
              local_5d8.idx = iVar18;
              puVar23 = local_750;
              pnVar22 = &local_5d8.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_5d8.val.m_backend.exp = iVar5;
              local_5d8.val.m_backend.neg = bVar3;
              local_5d8.val.m_backend.fpclass = fVar6;
              local_5d8.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_240,&local_5d8);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (iVar13 < 1) break;
              uVar34 = uVar34 - 1;
              pfVar20 = pfVar20 + -0x21;
            } while (lVar15 < (long)uVar34);
          }
        }
        else {
          if (iVar13 < (int)uVar30) {
            pfVar20 = &keys[iVar13].val.m_backend.fpclass;
            lVar29 = 0;
            do {
              local_b4.idx = pfVar20[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
              pnVar22 = &local_b4.val;
              for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_b4.val.m_backend.exp = pfVar20[-2];
              local_b4.val.m_backend.neg = *(bool *)(pfVar20 + -1);
              local_b4.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
              local_44c.idx = iVar18;
              puVar23 = local_750;
              pnVar22 = &local_44c.val;
              for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_44c.val.m_backend.exp = iVar5;
              local_44c.val.m_backend.neg = bVar3;
              local_44c.val.m_backend.fpclass = fVar6;
              local_44c.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_b4,&local_44c);
              if (local_848.fpclass == cpp_dec_float_NaN) {
                uVar27 = (ulong)(uint)(iVar13 - (int)lVar29);
                break;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (-1 < iVar12) {
                uVar27 = (ulong)(uint)(iVar13 - (int)lVar29);
                break;
              }
              lVar29 = lVar29 + -1;
              pfVar20 = pfVar20 + 0x21;
              uVar27 = uVar31;
            } while ((long)iVar13 - (long)(int)uVar30 != lVar29);
          }
          if (start_00 < iVar32) {
            uVar34 = (ulong)iVar32;
            pfVar20 = &keys[uVar34].val.m_backend.fpclass;
            do {
              local_138.idx = pfVar20[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
              pnVar22 = &local_138.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_138.val.m_backend.exp = pfVar20[-2];
              local_138.val.m_backend.neg = *(bool *)(pfVar20 + -1);
              local_138.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
              local_4d0.idx = iVar18;
              puVar23 = local_750;
              pnVar22 = &local_4d0.val;
              for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_4d0.val.m_backend.exp = iVar5;
              local_4d0.val.m_backend.neg = bVar3;
              local_4d0.val.m_backend.fpclass = fVar6;
              local_4d0.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_138,&local_4d0);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (iVar13 < 0) break;
              uVar34 = uVar34 - 1;
              pfVar20 = pfVar20 + -0x21;
            } while (lVar15 < (long)uVar34);
          }
        }
        iVar13 = (int)uVar27;
        iVar32 = (int)uVar34;
        if (iVar32 <= iVar13) goto LAB_0059fcba;
        pIVar14 = keys + iVar13;
        iVar12 = pIVar14->idx;
        pnVar22 = &pIVar14->val;
        puVar23 = local_7c8;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          *puVar23 = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
        }
        iVar8 = (pIVar14->val).m_backend.exp;
        bVar4 = (pIVar14->val).m_backend.neg;
        pIVar2 = keys + iVar32;
        pIVar14->idx = pIVar2->idx;
        pnVar22 = &pIVar2->val;
        pnVar24 = &pIVar14->val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + (ulong)bVar35 * -8 + 4);
        }
        (pIVar14->val).m_backend.exp = (pIVar2->val).m_backend.exp;
        (pIVar14->val).m_backend.neg = (pIVar2->val).m_backend.neg;
        pIVar2->idx = iVar12;
        puVar23 = local_7c8;
        pnVar22 = &pIVar2->val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
        }
        (pIVar2->val).m_backend.exp = iVar8;
        (pIVar2->val).m_backend.neg = bVar4;
        fVar10 = (pIVar14->val).m_backend.fpclass;
        iVar11 = (pIVar14->val).m_backend.prec_elem;
        iVar9 = (pIVar2->val).m_backend.prec_elem;
        (pIVar14->val).m_backend.fpclass = (pIVar2->val).m_backend.fpclass;
        (pIVar14->val).m_backend.prec_elem = iVar9;
        (pIVar2->val).m_backend.fpclass = fVar10;
        (pIVar2->val).m_backend.prec_elem = iVar11;
        uVar26 = (ulong)(iVar13 + 1);
        uVar34 = (ulong)(iVar32 - 1);
      } while( true );
    }
LAB_005a00ea:
    if (0 < (int)uVar17) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar30,compare,start);
    }
  }
  return;
LAB_0059fcba:
  if ((type & 1U) == 0) {
    if (start_00 < iVar32) {
      uVar34 = (ulong)iVar32;
      pfVar20 = &keys[uVar34].val.m_backend.fpclass;
      do {
        local_6e0.idx = iVar18;
        puVar23 = local_750;
        pnVar22 = &local_6e0.val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_348.idx = pfVar20[-0x1f];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
        pnVar22 = &local_348.val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_348.val.m_backend.exp = pfVar20[-2];
        local_348.val.m_backend.neg = *(bool *)(pfVar20 + -1);
        local_348.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
        local_6e0.val.m_backend.exp = iVar5;
        local_6e0.val.m_backend.neg = bVar3;
        local_6e0.val.m_backend.fpclass = fVar6;
        local_6e0.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_6e0,&local_348);
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_3c8,0,(type *)0x0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&local_3c8);
        if (0 < iVar13) break;
        uVar34 = uVar34 - 1;
        pfVar20 = pfVar20 + -0x21;
      } while (lVar15 < (long)uVar34);
    }
    if ((uint)uVar34 == uVar30) {
      pIVar14 = keys + (int)uVar30;
      iVar18 = pIVar14->idx;
      pnVar22 = &pIVar14->val;
      puVar23 = local_7c8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
      }
      iVar5 = (pIVar14->val).m_backend.exp;
      bVar3 = (pIVar14->val).m_backend.neg;
      pIVar14->idx = pIVar1->idx;
      pnVar22 = pnVar25;
      pnVar24 = &pIVar14->val;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + (ulong)bVar35 * -8 + 4);
      }
      (pIVar14->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar14->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar18;
      puVar23 = local_7c8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar14->val).m_backend.fpclass;
      iVar9 = (pIVar14->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar14->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar14->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar34 = (ulong)(uVar30 - 1);
    }
  }
  else {
    if (iVar13 < (int)uVar30) {
      pfVar20 = &keys[iVar13].val.m_backend.fpclass;
      uVar26 = uVar27;
      do {
        local_65c.idx = iVar18;
        puVar23 = local_750;
        pnVar22 = &local_65c.val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_2c4.idx = pfVar20[-0x1f];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
        pnVar22 = &local_2c4.val;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_2c4.val.m_backend.exp = pfVar20[-2];
        local_2c4.val.m_backend.neg = *(bool *)(pfVar20 + -1);
        local_2c4.val.m_backend._120_8_ = *(undefined8 *)pfVar20;
        local_65c.val.m_backend.exp = iVar5;
        local_65c.val.m_backend.neg = bVar3;
        local_65c.val.m_backend.fpclass = fVar6;
        local_65c.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_65c,&local_2c4);
        uVar27 = uVar26;
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_3c8,0,(type *)0x0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&local_3c8);
        if (iVar13 < 0) break;
        uVar17 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar17;
        pfVar20 = pfVar20 + 0x21;
        uVar27 = uVar31;
      } while (uVar30 != uVar17);
    }
    if ((int)uVar27 == start_00) {
      pIVar14 = keys + lVar15;
      iVar18 = pIVar14->idx;
      pnVar22 = &pIVar14->val;
      puVar23 = local_7c8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
      }
      iVar5 = (pIVar14->val).m_backend.exp;
      bVar3 = (pIVar14->val).m_backend.neg;
      pIVar14->idx = pIVar1->idx;
      pnVar22 = pnVar25;
      pnVar24 = &pIVar14->val;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + (ulong)bVar35 * -8 + 4);
      }
      (pIVar14->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar14->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar18;
      puVar23 = local_7c8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar14->val).m_backend.fpclass;
      iVar9 = (pIVar14->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar14->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar14->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar27 = (ulong)(start_00 + 1);
    }
  }
  uVar33 = (uint)uVar34;
  uVar17 = uVar33 - start_00;
  iVar18 = (int)uVar27;
  uVar19 = uVar30 - iVar18;
  if ((int)uVar19 < (int)uVar17) {
    uVar31 = uVar34 & 0xffffffff;
    uVar27 = uVar28;
    uVar19 = uVar17;
    uVar33 = uVar30;
    start_00 = iVar18;
    if ((int)uVar30 <= iVar18) goto LAB_005a00cf;
  }
  else {
    uVar28 = uVar27;
    uVar17 = uVar19;
    if ((int)uVar33 <= start_00) goto LAB_005a00cf;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar33 + 1,compare,start_00,(bool)(~type & 1));
  uVar28 = uVar27;
  uVar17 = uVar19;
LAB_005a00cf:
  uVar30 = (uint)uVar31;
  start = (int)uVar28;
  type = (bool)(type ^ 1);
  if ((int)uVar17 < 0x19) goto LAB_005a00ea;
  goto LAB_0059f62f;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}